

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

int diwcmp(void *a,void *b)

{
  GLWall *pGVar1;
  ulong uVar2;
  
  pGVar1 = (sortinfo->walls).Array;
  uVar2 = (long)pGVar1[*(int *)((long)a + 4)].gltexture -
          (long)pGVar1[*(int *)((long)b + 4)].gltexture;
  if (uVar2 != 0) {
    return (int)(uVar2 >> 3) * -0x45d1745d;
  }
  return (pGVar1[*(int *)((long)a + 4)].flags & 3) - (pGVar1[*(int *)((long)b + 4)].flags & 3);
}

Assistant:

static int diwcmp (const void *a, const void *b)
{
	const GLDrawItem * di1 = (const GLDrawItem *)a;
	GLWall * w1=&sortinfo->walls[di1->index];

	const GLDrawItem * di2 = (const GLDrawItem *)b;
	GLWall * w2=&sortinfo->walls[di2->index];

	if (w1->gltexture != w2->gltexture) return w1->gltexture - w2->gltexture;
	return ((w1->flags & 3) - (w2->flags & 3));
}